

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Clone.cpp
# Opt level: O2

tuple<TimeRepresentation<count_time<9,_long>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
* __thiscall
helics::apps::Clone::getValue_abi_cxx11_
          (tuple<TimeRepresentation<count_time<9,_long>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,Clone *this,int index)

{
  pointer pVVar1;
  reference this_00;
  string *__tail;
  TimeRepresentation<count_time<9,_long>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  if (-1 < index) {
    pVVar1 = (this->points).
             super__Vector_base<helics::apps::Clone::ValueCapture,_std::allocator<helics::apps::Clone::ValueCapture>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (index < (int)(((long)(this->points).
                             super__Vector_base<helics::apps::Clone::ValueCapture,_std::allocator<helics::apps::Clone::ValueCapture>_>
                             ._M_impl.super__Vector_impl_data._M_finish - (long)pVVar1) / 0x30)) {
      this_00 = CLI::std::_Deque_iterator<helics::Input,_helics::Input_&,_helics::Input_*>::
                operator[](&(this->subscriptions).
                            super__Deque_base<helics::Input,_std::allocator<helics::Input>_>._M_impl
                            .super__Deque_impl_data._M_start,(long)pVVar1[(uint)index].index);
      __tail = Input::getTarget_abi_cxx11_(this_00);
      CLI::std::
      _Tuple_impl<0UL,_TimeRepresentation<count_time<9,_long>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::_Tuple_impl(&__return_storage_ptr__->
                     super__Tuple_impl<0UL,_TimeRepresentation<count_time<9,_long>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ,&pVVar1[(uint)index].time,__tail,
                    &(this->points).
                     super__Vector_base<helics::apps::Clone::ValueCapture,_std::allocator<helics::apps::Clone::ValueCapture>_>
                     ._M_impl.super__Vector_impl_data._M_start[(uint)index].value);
      return __return_storage_ptr__;
    }
  }
  local_68.internalTimeCode = 0;
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  local_40._M_string_length = 0;
  local_40.field_2._M_local_buf[0] = '\0';
  local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  local_60._M_string_length = 0;
  local_60.field_2._M_local_buf[0] = '\0';
  CLI::std::
  tuple<TimeRepresentation<count_time<9,_long>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::
  tuple<TimeRepresentation<count_time<9,_long>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_true>
            (__return_storage_ptr__,&local_68,&local_40,&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_40);
  return __return_storage_ptr__;
}

Assistant:

std::tuple<Time, std::string, std::string> Clone::getValue(int index) const
{
    if (isValidIndex(index, points)) {
        return {points[index].time,
                subscriptions[points[index].index].getTarget(),
                points[index].value};
    }
    return {Time(), std::string(), std::string()};
}